

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O2

QString * __thiscall
QFileInfoPrivate::getFileName(QString *__return_storage_ptr__,QFileInfoPrivate *this,FileName name)

{
  QAbstractFileEngine *pQVar1;
  undefined1 *puVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  long in_FS_OFFSET;
  QFileSystemEntry entry;
  QArrayDataPointer<char16_t> local_98;
  undefined1 local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)&this->field_0x1d8 < 0) && (this->fileNames[(int)name].d.ptr != (char16_t *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QArrayDataPointer<char16_t>::QArrayDataPointer
                (&__return_storage_ptr__->d,&this->fileNames[(int)name].d);
      return __return_storage_ptr__;
    }
    goto LAB_0010fb7a;
  }
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  pQVar1 = (this->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  if (pQVar1 != (QAbstractFileEngine *)0x0) {
    (*pQVar1->_vptr_QAbstractFileEngine[0x19])(local_78,pQVar1,(ulong)name);
    pDVar4 = (__return_storage_ptr__->d).d;
    pcVar5 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)local_78._0_8_;
    (__return_storage_ptr__->d).ptr = (char16_t *)local_78._8_8_;
    puVar2 = (undefined1 *)(__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_78._16_8_;
    local_78._0_8_ = pDVar4;
    local_78._8_8_ = pcVar5;
    local_78._16_8_ = puVar2;
LAB_0010f804:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
    goto switchD_0010f864_default;
  }
  switch(name) {
  case AbsoluteName:
  case AbsolutePathName:
    local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEngine::absoluteName((QFileSystemEntry *)local_78,&this->fileEntry);
    if (*(int *)&this->field_0x1d8 < 0) {
      QFileSystemEntry::filePath((QString *)&local_98,(QFileSystemEntry *)local_78);
      pDVar4 = this->fileNames[3].d.d;
      pcVar5 = this->fileNames[3].d.ptr;
      this->fileNames[3].d.d = local_98.d;
      this->fileNames[3].d.ptr = local_98.ptr;
      qVar3 = this->fileNames[3].d.size;
      this->fileNames[3].d.size = local_98.size;
      local_98.d = pDVar4;
      local_98.ptr = pcVar5;
      local_98.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      QFileSystemEntry::path((QString *)&local_98,(QFileSystemEntry *)local_78);
      pDVar4 = this->fileNames[4].d.d;
      pcVar5 = this->fileNames[4].d.ptr;
      this->fileNames[4].d.d = local_98.d;
      this->fileNames[4].d.ptr = local_98.ptr;
      qVar3 = this->fileNames[4].d.size;
      this->fileNames[4].d.size = local_98.size;
      local_98.d = pDVar4;
      local_98.ptr = pcVar5;
      local_98.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    }
    if (name == AbsoluteName) goto LAB_0010f942;
LAB_0010fa36:
    QFileSystemEntry::path((QString *)&local_98,(QFileSystemEntry *)local_78);
    goto LAB_0010fa46;
  case AbsoluteLinkTarget:
    QFileSystemEngine::getLinkTarget((QFileSystemEntry *)local_78,&this->fileEntry,&this->metaData);
    break;
  case CanonicalName:
  case CanonicalPathName:
    local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEngine::canonicalName((QFileSystemEntry *)local_78,&this->fileEntry,&this->metaData);
    if (*(int *)&this->field_0x1d8 < 0) {
      QFileSystemEntry::filePath((QString *)&local_98,(QFileSystemEntry *)local_78);
      pDVar4 = this->fileNames[6].d.d;
      pcVar5 = this->fileNames[6].d.ptr;
      this->fileNames[6].d.d = local_98.d;
      this->fileNames[6].d.ptr = local_98.ptr;
      qVar3 = this->fileNames[6].d.size;
      this->fileNames[6].d.size = local_98.size;
      local_98.d = pDVar4;
      local_98.ptr = pcVar5;
      local_98.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      QFileSystemEntry::path((QString *)&local_98,(QFileSystemEntry *)local_78);
      pDVar4 = this->fileNames[7].d.d;
      pcVar5 = this->fileNames[7].d.ptr;
      this->fileNames[7].d.d = local_98.d;
      this->fileNames[7].d.ptr = local_98.ptr;
      qVar3 = this->fileNames[7].d.size;
      this->fileNames[7].d.size = local_98.size;
      local_98.d = pDVar4;
      local_98.ptr = pcVar5;
      local_98.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    }
    if (name != CanonicalName) goto LAB_0010fa36;
LAB_0010f942:
    QFileSystemEntry::filePath((QString *)&local_98,(QFileSystemEntry *)local_78);
LAB_0010fa46:
    pDVar4 = (__return_storage_ptr__->d).d;
    pcVar5 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_98.d;
    (__return_storage_ptr__->d).ptr = local_98.ptr;
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_98.size;
    local_98.d = pDVar4;
    local_98.ptr = pcVar5;
    local_98.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    goto LAB_0010fb1a;
  case BundleName:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    local_78._0_8_ = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    local_78._8_8_ = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    local_78._16_8_ = (undefined1 *)0x0;
    goto LAB_0010f804;
  case JunctionName:
    QFileSystemEngine::getJunctionTarget
              ((QFileSystemEntry *)local_78,&this->fileEntry,&this->metaData);
    break;
  case RawLinkPath:
    QFileSystemEngine::getRawLinkPath((QFileSystemEntry *)local_78,&this->fileEntry,&this->metaData)
    ;
    break;
  default:
    goto switchD_0010f864_default;
  }
  QFileSystemEntry::filePath((QString *)&local_98,(QFileSystemEntry *)local_78);
  pDVar4 = (__return_storage_ptr__->d).d;
  pcVar5 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).d = local_98.d;
  (__return_storage_ptr__->d).ptr = local_98.ptr;
  qVar3 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_98.size;
  local_98.d = pDVar4;
  local_98.ptr = pcVar5;
  local_98.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
LAB_0010fb1a:
  QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)local_78);
switchD_0010f864_default:
  if ((__return_storage_ptr__->d).ptr == (char16_t *)0x0) {
    QString::operator=(__return_storage_ptr__,(QLatin1StringView)ZEXT816(0x12919c));
  }
  if (*(int *)&this->field_0x1d8 < 0) {
    QString::operator=((QString *)&this->fileNames[(int)name].d,__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0010fb7a:
  __stack_chk_fail();
}

Assistant:

QString QFileInfoPrivate::getFileName(QAbstractFileEngine::FileName name) const
{
    if (cache_enabled && !fileNames[(int)name].isNull())
        return fileNames[(int)name];

    QString ret;
    if (fileEngine == nullptr) { // local file; use the QFileSystemEngine directly
        switch (name) {
            case QAbstractFileEngine::CanonicalName:
            case QAbstractFileEngine::CanonicalPathName: {
                QFileSystemEntry entry = QFileSystemEngine::canonicalName(fileEntry, metaData);
                if (cache_enabled) { // be smart and store both
                    fileNames[QAbstractFileEngine::CanonicalName] = entry.filePath();
                    fileNames[QAbstractFileEngine::CanonicalPathName] = entry.path();
                }
                if (name == QAbstractFileEngine::CanonicalName)
                    ret = entry.filePath();
                else
                    ret = entry.path();
                break;
            }
            case QAbstractFileEngine::AbsoluteLinkTarget:
                ret = QFileSystemEngine::getLinkTarget(fileEntry, metaData).filePath();
                break;
            case QAbstractFileEngine::RawLinkPath:
                ret = QFileSystemEngine::getRawLinkPath(fileEntry, metaData).filePath();
                break;
            case QAbstractFileEngine::JunctionName:
                ret = QFileSystemEngine::getJunctionTarget(fileEntry, metaData).filePath();
                break;
            case QAbstractFileEngine::BundleName:
                ret = QFileSystemEngine::bundleName(fileEntry);
                break;
            case QAbstractFileEngine::AbsoluteName:
            case QAbstractFileEngine::AbsolutePathName: {
                QFileSystemEntry entry = QFileSystemEngine::absoluteName(fileEntry);
                if (cache_enabled) { // be smart and store both
                    fileNames[QAbstractFileEngine::AbsoluteName] = entry.filePath();
                    fileNames[QAbstractFileEngine::AbsolutePathName] = entry.path();
                }
                if (name == QAbstractFileEngine::AbsoluteName)
                    ret = entry.filePath();
                else
                    ret = entry.path();
                break;
            }
            default: break;
        }
    } else {
        ret = fileEngine->fileName(name);
    }
    if (ret.isNull())
        ret = ""_L1;
    if (cache_enabled)
        fileNames[(int)name] = ret;
    return ret;
}